

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

double ecs_time_measure(ecs_time_t *start)

{
  ecs_time_t in_RAX;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ecs_time_t stop;
  ecs_time_t local_18;
  
  local_18 = in_RAX;
  (*ecs_os_api.get_time_)(&local_18);
  uVar3 = (ulong)local_18 >> 0x20;
  uVar4 = (ulong)*start >> 0x20;
  uVar5 = uVar3 + 1000000000;
  uVar1 = (*start).sec;
  uVar2 = ~uVar1;
  if (uVar4 <= uVar3) {
    uVar5 = uVar3;
    uVar2 = -uVar1;
  }
  *start = local_18;
  return (double)(uVar5 - uVar4 & 0xffffffff) / 1000000000.0 + (double)(local_18.sec + uVar2);
}

Assistant:

double ecs_time_measure(
    ecs_time_t *start)
{
    ecs_time_t stop, temp;
    ecs_os_get_time(&stop);
    temp = stop;
    stop = ecs_time_sub(stop, *start);
    *start = temp;
    return ecs_time_to_double(stop);
}